

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModel.cpp
# Opt level: O0

void __thiscall HighsModel::userCostScale(HighsModel *this,HighsInt user_cost_scale)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  __type_conflict _Var4;
  HighsInt iEl;
  double dl_user_cost_scale_value;
  HighsInt dl_user_cost_scale;
  int local_1c;
  double dVar5;
  
  iVar1 = in_ESI - *(int *)(in_RDI + 0x204);
  if (iVar1 != 0) {
    _Var4 = std::pow<int,int>(0,0x6b96bf);
    if (*(int *)(in_RDI + 0x398) != 0) {
      for (local_1c = 0;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3a0),
                              (long)*(int *)(in_RDI + 0x398)), local_1c < *pvVar2;
          local_1c = local_1c + 1) {
        dVar5 = _Var4;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3d0),
                            (long)local_1c);
        *pvVar3 = _Var4 * *pvVar3;
        _Var4 = dVar5;
      }
    }
    HighsLp::userCostScale((HighsLp *)CONCAT44(in_ESI,iVar1),(HighsInt)((ulong)_Var4 >> 0x20));
  }
  return;
}

Assistant:

void HighsModel::userCostScale(const HighsInt user_cost_scale) {
  const HighsInt dl_user_cost_scale =
      user_cost_scale - this->lp_.user_cost_scale_;
  if (!dl_user_cost_scale) return;
  double dl_user_cost_scale_value = std::pow(2, dl_user_cost_scale);
  if (this->hessian_.dim_) {
    for (HighsInt iEl = 0; iEl < this->hessian_.start_[this->hessian_.dim_];
         iEl++)
      this->hessian_.value_[iEl] *= dl_user_cost_scale_value;
  }
  this->lp_.userCostScale(user_cost_scale);
}